

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContextTlsEntry.h
# Opt level: O0

void __thiscall
ThreadContextScope::ThreadContextScope(ThreadContextScope *this,ThreadContext *threadContext)

{
  code *pcVar1;
  bool bVar2;
  ThreadContextTLSEntry *pTVar3;
  ThreadContext *pTVar4;
  undefined4 *puVar5;
  byte local_29;
  ThreadContext *local_28;
  ThreadContext *threadContext_local;
  ThreadContextScope *this_local;
  
  bVar2 = ThreadContext::IsThreadBound(threadContext);
  if (bVar2) {
    pTVar4 = ThreadContext::GetContextForCurrentThread();
    if (pTVar4 != threadContext) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Base/ThreadContextTlsEntry.h"
                         ,0x35,"(ThreadContext::GetContextForCurrentThread() == threadContext)",
                         "ThreadContext::GetContextForCurrentThread() == threadContext");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    this->isValid = true;
    this->wasInUse = true;
    this->doCleanup = false;
  }
  else {
    pTVar3 = ThreadContextTLSEntry::GetEntryForCurrentThread();
    if (pTVar3 == (ThreadContextTLSEntry *)0x0) {
      local_28 = (ThreadContext *)0x0;
    }
    else {
      pTVar3 = ThreadContextTLSEntry::GetEntryForCurrentThread();
      local_28 = ThreadContextTLSEntry::GetThreadContext(pTVar3);
    }
    this->originalContext = local_28;
    this->wasInUse = threadContext == this->originalContext;
    bVar2 = ThreadContextTLSEntry::TrySetThreadContext(threadContext);
    this->isValid = bVar2;
    local_29 = 0;
    if ((this->wasInUse & 1U) == 0) {
      local_29 = this->isValid;
    }
    this->doCleanup = (bool)(local_29 & 1);
  }
  return;
}

Assistant:

ThreadContextScope(ThreadContext * threadContext)
    {
        if (!threadContext->IsThreadBound())
        {
            originalContext = ThreadContextTLSEntry::GetEntryForCurrentThread() ?
                ThreadContextTLSEntry::GetEntryForCurrentThread()->GetThreadContext() : NULL;
            wasInUse = threadContext == originalContext;
            isValid = ThreadContextTLSEntry::TrySetThreadContext(threadContext);
            doCleanup = !wasInUse && isValid;
        }
        else
        {
            Assert(ThreadContext::GetContextForCurrentThread() == threadContext);
            isValid = true;
            wasInUse = true;
            doCleanup = false;
        }
    }